

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

cmCPackComponent * __thiscall
cmCPackIFWGenerator::GetComponent
          (cmCPackIFWGenerator *this,string *projectName,string *componentName)

{
  cmCPackLog *this_00;
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  ostream *poVar4;
  char *msg;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_cmCPackIFWPackage_*>_>::value,_pair<iterator,_bool>_>
  _Var5;
  string local_2a0 [32];
  undefined1 local_280 [8];
  ostringstream cmCPackLog_msg;
  pair<cmCPackComponent_*,_cmCPackIFWPackage_*> local_d8;
  _Base_ptr local_c8;
  undefined1 local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>
  local_b8;
  cmCPackIFWPackage *local_90;
  cmCPackIFWPackage *package;
  _Self local_80 [3];
  _Self local_68;
  iterator pit;
  string name;
  cmCPackComponent *component;
  _Self local_30;
  iterator cit;
  string *componentName_local;
  string *projectName_local;
  cmCPackIFWGenerator *this_local;
  
  cit._M_node = (_Base_ptr)componentName;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
       ::find(&(this->super_cmCPackGenerator).Components,componentName);
  component = (cmCPackComponent *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
              ::end(&(this->super_cmCPackGenerator).Components);
  bVar1 = std::operator!=(&local_30,(_Self *)&component);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
             ::operator->(&local_30);
    this_local = (cmCPackIFWGenerator *)&ppVar3->second;
  }
  else {
    name.field_2._8_8_ =
         cmCPackGenerator::GetComponent
                   (&this->super_cmCPackGenerator,projectName,(string *)cit._M_node);
    this_local = (cmCPackIFWGenerator *)name.field_2._8_8_;
    if ((cmCPackIFWGenerator *)name.field_2._8_8_ != (cmCPackIFWGenerator *)0x0) {
      GetComponentPackageName_abi_cxx11_((string *)&pit,this,(cmCPackComponent *)name.field_2._8_8_)
      ;
      local_68._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
           ::find(&this->Packages,(string *)&pit);
      local_80[0]._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
           ::end(&this->Packages);
      bVar1 = std::operator!=(&local_68,local_80);
      if (!bVar1) {
        local_90 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                   ::operator[](&this->Packages,(key_type *)&pit);
        std::__cxx11::string::operator=((string *)&local_90->Name,(string *)&pit);
        (local_90->super_cmCPackIFWCommon).Generator = this;
        iVar2 = cmCPackIFWPackage::ConfigureFromComponent
                          (local_90,(cmCPackComponent *)name.field_2._8_8_);
        if (iVar2 == 0) {
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
          ::erase(&this->Packages,(key_type *)&pit);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
          poVar4 = std::operator<<((ostream *)local_280,"Cannot configure package \"");
          poVar4 = std::operator<<(poVar4,(string *)&pit);
          poVar4 = std::operator<<(poVar4,"\" for component \"");
          poVar4 = std::operator<<(poVar4,(string *)name.field_2._8_8_);
          poVar4 = std::operator<<(poVar4,"\"");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          if ((this->super_cmCPackIFWCommon).Generator != (cmCPackIFWGenerator *)0x0) {
            this_00 = (((this->super_cmCPackIFWCommon).Generator)->super_cmCPackGenerator).Logger;
            std::__cxx11::ostringstream::str();
            msg = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(this_00,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                            ,0x205,msg);
            std::__cxx11::string::~string(local_2a0);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
        }
        else {
          local_90->Installer = &this->Installer;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmCPackIFWPackage_*&,_true>
                    (&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pit,
                     &local_90);
          _Var5 = std::
                  map<std::__cxx11::string,cmCPackIFWPackage*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>>
                  ::insert<std::pair<std::__cxx11::string,cmCPackIFWPackage*>>
                            ((map<std::__cxx11::string,cmCPackIFWPackage*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>>
                              *)&(this->Installer).Packages,&local_b8);
          local_c8 = (_Base_ptr)_Var5.first._M_node;
          local_c0 = _Var5.second;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>
          ::~pair(&local_b8);
          std::pair<cmCPackComponent_*,_cmCPackIFWPackage_*>::
          pair<cmCPackComponent_*&,_cmCPackIFWPackage_*&,_true>
                    (&local_d8,(cmCPackComponent **)((long)&name.field_2 + 8),&local_90);
          std::
          map<cmCPackComponent*,cmCPackIFWPackage*,std::less<cmCPackComponent*>,std::allocator<std::pair<cmCPackComponent*const,cmCPackIFWPackage*>>>
          ::insert<std::pair<cmCPackComponent*,cmCPackIFWPackage*>>
                    ((map<cmCPackComponent*,cmCPackIFWPackage*,std::less<cmCPackComponent*>,std::allocator<std::pair<cmCPackComponent*const,cmCPackIFWPackage*>>>
                      *)&this->ComponentPackages,&local_d8);
          if ((*(byte *)(name.field_2._8_8_ + 0x48) >> 3 & 1) == 0) {
            std::
            set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
            ::insert(&this->BinaryPackages,&local_90);
          }
          else {
            std::
            set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
            ::insert(&this->DownloadedPackages,&local_90);
          }
        }
      }
      this_local = (cmCPackIFWGenerator *)name.field_2._8_8_;
      package._4_4_ = 1;
      std::__cxx11::string::~string((string *)&pit);
    }
  }
  return (cmCPackComponent *)this_local;
}

Assistant:

cmCPackComponent* cmCPackIFWGenerator::GetComponent(
  const std::string& projectName, const std::string& componentName)
{
  auto cit = this->Components.find(componentName);
  if (cit != this->Components.end()) {
    return &(cit->second);
  }

  cmCPackComponent* component =
    this->cmCPackGenerator::GetComponent(projectName, componentName);
  if (!component) {
    return component;
  }

  std::string name = this->GetComponentPackageName(component);
  auto pit = this->Packages.find(name);
  if (pit != this->Packages.end()) {
    return component;
  }

  cmCPackIFWPackage* package = &this->Packages[name];
  package->Name = name;
  package->Generator = this;
  if (package->ConfigureFromComponent(component)) {
    package->Installer = &this->Installer;
    this->Installer.Packages.insert(
      std::pair<std::string, cmCPackIFWPackage*>(name, package));
    this->ComponentPackages.insert(
      std::pair<cmCPackComponent*, cmCPackIFWPackage*>(component, package));
    if (component->IsDownloaded) {
      this->DownloadedPackages.insert(package);
    } else {
      this->BinaryPackages.insert(package);
    }
  } else {
    this->Packages.erase(name);
    cmCPackIFWLogger(ERROR,
                     "Cannot configure package \""
                       << name << "\" for component \"" << component->Name
                       << "\"" << std::endl);
  }

  return component;
}